

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

double __thiscall wasm::Literal::fma(Literal *this,double __x,double __y,double __z)

{
  BasicType BVar1;
  Literal *in_RCX;
  Literal *in_RDX;
  Literal *in_RSI;
  float fVar2;
  float __y_00;
  float __z_00;
  double extraout_XMM0_Qa;
  double dVar3;
  double __y_01;
  double __z_01;
  double extraout_XMM0_Qa_00;
  Literal *right_local;
  Literal *left_local;
  Literal *this_local;
  
  BVar1 = wasm::Type::getBasic(&in_RSI->type);
  if (BVar1 == f32) {
    fVar2 = getf32(in_RDX);
    __y_00 = getf32(in_RCX);
    __z_00 = getf32(in_RSI);
    fVar2 = fmaf(fVar2,__y_00,__z_00);
    Literal(this,fVar2);
    dVar3 = extraout_XMM0_Qa;
  }
  else {
    if (BVar1 != f64) {
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                         ,0x634);
    }
    dVar3 = getf64(in_RDX);
    __y_01 = getf64(in_RCX);
    __z_01 = getf64(in_RSI);
    dVar3 = ::fma(dVar3,__y_01,__z_01);
    Literal(this,dVar3);
    dVar3 = extraout_XMM0_Qa_00;
  }
  return dVar3;
}

Assistant:

Literal Literal::fma(const Literal& left, const Literal& right) const {
  switch (type.getBasic()) {
    case Type::f32:
      return Literal(::fmaf(left.getf32(), right.getf32(), getf32()));
      break;
    case Type::f64:
      return Literal(::fma(left.getf64(), right.getf64(), getf64()));
      break;
    default:
      WASM_UNREACHABLE("unexpected type");
  }
}